

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O1

boolean inherits(monst *shkp,int numsk,int croaked)

{
  short sVar1;
  int iVar2;
  char cVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  long lVar9;
  size_t sVar10;
  int *piVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  long amount;
  bool bVar15;
  char takes [256];
  char local_138 [4];
  undefined2 uStack_134;
  undefined8 uStack_132;
  
  cVar3 = u.ushops[0];
  if (numsk < 2) {
    if (((((u.ushops[0] == (char)shkp[0x1b].meating) && (iVar6 = inhishop(shkp), iVar6 != 0)) &&
         (*(short *)((long)&shkp[0x1b].misc_worn_check + 2) == 0)) &&
        ((iVar6._0_1_ = shkp[0x1b].mtame, iVar6._1_1_ = shkp[0x1b].m_ap_type,
         iVar6._2_1_ = shkp[0x1b].mfrozen, iVar6._3_1_ = shkp[0x1b].mblinded, iVar6 == 0 &&
         (*(int *)&shkp[0x1b].field_0x60 == 0)))) &&
       (((shkp->field_0x62 & 0x40) != 0 && (*(char *)((long)&shkp[0x1b].meating + 1) == '\0')))) {
      if (invent != (obj *)0x0) {
        pline("%s gratefully inherits all your possessions.",
              (undefined1 *)((long)&shkp[0x1c].minvent + 5));
      }
      set_repo_loc((eshk *)&shkp->field_0x74);
    }
    else {
      if (((*(short *)((long)&shkp[0x1b].misc_worn_check + 2) == 0) &&
          (*(int *)&shkp[0x1b].field_0x60 == 0)) &&
         (iVar7._0_1_ = shkp[0x1b].mtame, iVar7._1_1_ = shkp[0x1b].m_ap_type,
         iVar7._2_1_ = shkp[0x1b].mfrozen, iVar7._3_1_ = shkp[0x1b].mblinded, iVar7 == 0)) {
        bVar4 = 0;
        amount = 0;
      }
      else {
        if ((cVar3 == (char)shkp[0x1b].meating) && (iVar6 = inhishop(shkp), iVar6 != 0)) {
          sVar1 = *(short *)((long)&shkp[0x1b].misc_worn_check + 2);
          iVar6 = (int)sVar1;
          if (sVar1 == 0) {
            lVar9 = 0;
          }
          else {
            piVar11 = (int *)(*(long *)&shkp[0x1b].mnum + 0xc);
            lVar9 = 0;
            do {
              lVar9 = lVar9 + (long)*piVar11 * (long)piVar11[-1];
              piVar11 = piVar11 + 4;
              iVar6 = iVar6 + -1;
            } while (iVar6 != 0);
          }
          lVar9 = *(int *)&shkp[0x1b].field_0x60 + lVar9;
        }
        else {
          lVar9 = 0;
        }
        iVar2._0_1_ = shkp[0x1b].mtame;
        iVar2._1_1_ = shkp[0x1b].m_ap_type;
        iVar2._2_1_ = shkp[0x1b].mfrozen;
        iVar2._3_1_ = shkp[0x1b].mblinded;
        amount = (long)iVar2;
        if (iVar2 < lVar9) {
          amount = lVar9;
        }
        bVar4 = 1;
      }
      if ((*(char *)((long)&shkp[0x1b].meating + 1) != '\0') ||
         ((byte)(~bVar4 & (shkp->field_0x62 & 0x40) >> 6) == 0)) {
        if (invent == (obj *)0x0) {
          bVar15 = false;
        }
        else {
          lVar9 = money_cnt(invent);
          local_138[0] = '\0';
          if ((*(uint *)&shkp->field_0x60 & 0xc0000) != 0x40000) {
            sVar10 = strlen(local_138);
            builtin_strncpy(local_138 + sVar10,"wakes up",8);
            *(undefined8 *)((long)&uStack_132 + sVar10) = 0x20646e61207075;
          }
          iVar6 = dist2((int)shkp->mx,(int)shkp->my,(int)u.ux,(int)u.uy);
          if (2 < iVar6) {
            sVar10 = strlen(local_138);
            builtin_strncpy(local_138 + sVar10,"comes an",8);
            *(undefined4 *)((long)&uStack_132 + sVar10 + 1) = 0x20646e;
          }
          sVar10 = strlen(local_138);
          builtin_strncpy(local_138 + sVar10,"take",4);
          *(undefined2 *)((long)&uStack_134 + sVar10) = 0x73;
          if ((amount == 0 || lVar9 < amount) || (cVar3 == (char)shkp[0x1b].meating)) {
            iVar7 = *(int *)&shkp[0x1b].mtame - (int)lVar9;
            iVar6 = 0;
            if (0 < iVar7) {
              iVar6 = iVar7;
            }
            shkp[0x1b].mtame = (char)iVar6;
            shkp[0x1b].m_ap_type = (char)((uint)iVar6 >> 8);
            shkp[0x1b].mfrozen = (char)((uint)iVar6 >> 0x10);
            shkp[0x1b].mblinded = (char)((uint)iVar6 >> 0x18);
            if (0 < lVar9) {
              money2mon(shkp,lVar9);
            }
            iflags.botl = '\x01';
            pline("%s %s all your possessions.",(undefined1 *)((long)&shkp[0x1c].minvent + 5),
                  local_138);
            set_repo_loc((eshk *)&shkp->field_0x74);
            bVar15 = true;
          }
          else {
            money2mon(shkp,amount);
            iflags.botl = '\x01';
            pcVar8 = Monnam(shkp);
            pcVar13 = currency(amount);
            iVar6 = strncmp(&shkp[0x1b].field_0x75,plname,0x20);
            pcVar14 = "";
            if (iVar6 == 0) {
              pcVar14 = "you ";
            }
            pcVar12 = "her";
            if ((shkp->field_0x60 & 1) == 0) {
              pcVar12 = "him";
            }
            bVar15 = false;
            pline("%s %s the %ld %s %sowed %s.",pcVar8,local_138,amount,pcVar13,pcVar14,pcVar12);
            pacify_shk(shkp);
            *(undefined1 *)((long)&shkp[0x1b].meating + 1) = 0;
            shkp[0x1b].mtame = '\0';
            shkp[0x1b].m_ap_type = '\0';
            shkp[0x1b].mfrozen = '\0';
            shkp[0x1b].mblinded = '\0';
          }
        }
        goto LAB_0023c916;
      }
    }
    bVar15 = false;
  }
  else {
    if ((croaked != 0) && ((viz_array[shkp->my][shkp->mx] & 2U) != 0)) {
      pcVar8 = Monnam(shkp);
      pcVar14 = "";
      pcVar13 = "wakes up, ";
      if ((*(uint *)&shkp->field_0x60 >> 0x13 & 1) == 0) {
        pcVar13 = "";
      }
      if ((*(uint *)&shkp->field_0x60 >> 0x12 & 1) == 0) {
        pcVar13 = "wakes up, ";
      }
      uVar5 = mt_random();
      if (((uVar5 & 1) == 0) && (pcVar14 = ", shakes her head,", (shkp->field_0x60 & 1) == 0)) {
        pcVar14 = ", shakes his head,";
      }
      iVar6 = inhishop(shkp);
      pcVar12 = "sighs";
      if (iVar6 == 0) {
        pcVar12 = "disappears";
      }
      pline("%s %slooks at your corpse%s and %s.",pcVar8,pcVar13,pcVar14,pcVar12);
    }
    if ((*(uint *)&shkp->field_0x60 & 0xc0000) != 0x40000) {
      shkp->mfrozen = '\0';
      *(uint *)&shkp->field_0x60 = *(uint *)&shkp->field_0x60 & 0xfff3ffff | 0x40000;
    }
    bVar15 = cVar3 == (char)shkp[0x1b].meating;
LAB_0023c916:
    if ((*(uint *)&shkp->field_0x60 & 0xc0000) != 0x40000) {
      shkp->mfrozen = '\0';
      *(uint *)&shkp->field_0x60 = *(uint *)&shkp->field_0x60 & 0xfff3ffff | 0x40000;
    }
    iVar6 = inhishop(shkp);
    if (iVar6 == 0) {
      home_shk(shkp,'\0');
    }
  }
  setpaid(shkp);
  return bVar15;
}

Assistant:

static boolean inherits(struct monst *shkp, int numsk, int croaked)
{
	long loss = 0L;
	long umoney;
	struct eshk *eshkp = ESHK(shkp);
	boolean take = FALSE, taken = FALSE;
	int roomno = *u.ushops;
	char takes[BUFSZ];

	/* the simplifying principle is that first-come */
	/* already took everything you had.		*/
	if (numsk > 1) {
	    if (cansee(shkp->mx, shkp->my) && croaked)
		pline("%s %slooks at your corpse%s and %s.",
		      Monnam(shkp),
		      (!shkp->mcanmove || shkp->msleeping) ? "wakes up, " : "",
		      !rn2(2) ? (shkp->female ? ", shakes her head," :
			   ", shakes his head,") : "",
		      !inhishop(shkp) ? "disappears" : "sighs");
	    rouse_shk(shkp, FALSE);	/* wake shk for bones */
	    taken = (roomno == eshkp->shoproom);
	    goto skip;
	}

	/* get one case out of the way: you die in the shop, the */
	/* shopkeeper is peaceful, nothing stolen, nothing owed. */
	if (roomno == eshkp->shoproom && inhishop(shkp) &&
	    !eshkp->billct && !eshkp->robbed && !eshkp->debit &&
	     NOTANGRY(shkp) && !eshkp->following) {
		if (invent)
			pline("%s gratefully inherits all your possessions.",
				shkname(shkp));
		set_repo_loc(eshkp);
		goto clear;
	}

	if (eshkp->billct || eshkp->debit || eshkp->robbed) {
		if (roomno == eshkp->shoproom && inhishop(shkp))
		    loss = addupbill(shkp) + eshkp->debit;
		if (loss < eshkp->robbed) loss = eshkp->robbed;
		take = TRUE;
	}

	if (eshkp->following || ANGRY(shkp) || take) {
		if (!invent) goto skip;
                umoney = money_cnt(invent);
		takes[0] = '\0';
		if (!shkp->mcanmove || shkp->msleeping)
			strcat(takes, "wakes up and ");
		if (distu(shkp->mx, shkp->my) > 2)
			strcat(takes, "comes and ");
		strcat(takes, "takes");

		if (loss > umoney || !loss || roomno == eshkp->shoproom) {
			eshkp->robbed -= umoney;
			if (eshkp->robbed < 0L) eshkp->robbed = 0L;
                        if (umoney > 0) money2mon(shkp, umoney);
			iflags.botl = 1;
			pline("%s %s all your possessions.",
			      shkname(shkp), takes);
			taken = TRUE;
			/* where to put player's invent (after disclosure) */
			set_repo_loc(eshkp);
		} else {
                        money2mon(shkp, loss);
			iflags.botl = 1;
			pline("%s %s the %ld %s %sowed %s.",
			      Monnam(shkp), takes,
			      loss, currency(loss),
			      strncmp(eshkp->customer, plname, PL_NSIZ) ?
					"" : "you ",
			      shkp->female ? "her" : "him");
			/* shopkeeper has now been paid in full */
			pacify_shk(shkp);
			eshkp->following = 0;
			eshkp->robbed = 0L;
		}
skip:
		/* in case we create bones */
		rouse_shk(shkp, FALSE);	/* wake up */
		if (!inhishop(shkp))
			home_shk(shkp, FALSE);
	}
clear:
	setpaid(shkp);
	return taken;
}